

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mxv_basic_orix.cpp
# Opt level: O0

bool test(void)

{
  ostream *poVar1;
  int j;
  Type f;
  int i;
  Type *rp;
  Type *vp;
  Type *mxp;
  int local_2c;
  float local_28;
  int local_24;
  
  local_24 = 0;
  while( true ) {
    if (5999 < local_24) {
      return true;
    }
    local_28 = 0.0;
    for (local_2c = 0; local_2c < 6000; local_2c = local_2c + 1) {
      local_28 = mx[0][local_24 * 6000 + local_2c] * v[local_2c] + local_28;
    }
    if ((local_28 + 1.0 != result[local_24]) || (NAN(local_28 + 1.0) || NAN(result[local_24])))
    break;
    local_24 = local_24 + 1;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error at result ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
  poVar1 = std::operator<<(poVar1,' ');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28 + 1.0);
  poVar1 = std::operator<<(poVar1,"!=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,result[local_24]);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool test()
{
  const Type *mxp = (const Type *)mx;
  const Type *vp  = (const Type *)v;
  const Type *rp  = (const Type *)result;
  
  for (int i = 0; i < M; i++) {
    Type f = (Type)0;
    for(int j = 0; j < N; j++)
      f += mxp[i * N + j] * vp[j];
    if ( (f + (Type)1) != rp[i]) {
      std::cerr << "Error at result " << i << ' ' << (f + (Type)1) << "!=" << rp[i] << std::endl;
      return false;
    }
  }
  
  return true;
}